

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O3

_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*> * __thiscall
cs_impl::
cni_helper<std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>(*)(std::deque<cs_impl::any,std::allocator<cs_impl::any>>&,std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>&,cs_impl::any_const&),std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>(*)(std::deque<cs_impl::any,std::allocator<cs_impl::any>>&,std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>&,cs_impl::any_const&)>
::_call<0,1,2>(_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*> *__return_storage_ptr__
              ,void *this,vector *args,sequence<0,_1,_2> *param_2)

{
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *pdVar1;
  _Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*> *p_Var2;
  _Elt_pointer local_48;
  _Elt_pointer paStack_40;
  _Elt_pointer local_38;
  _Map_pointer ppaStack_30;
  
  pdVar1 = try_convert_and_check<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>,_0UL>
           ::convert((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                     .super__Vector_impl_data._M_start);
  p_Var2 = try_convert_and_check<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&,_std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&,_std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>,_1UL>
           ::convert((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                     .super__Vector_impl_data._M_start + 1);
  if (*(long *)((long)this + 0x10) != 0) {
    (**(code **)((long)this + 0x18))
              (&local_48,this,pdVar1,p_Var2,
               (args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
               super__Vector_impl_data._M_start + 2);
    __return_storage_ptr__->_M_cur = local_48;
    __return_storage_ptr__->_M_first = paStack_40;
    __return_storage_ptr__->_M_last = local_38;
    __return_storage_ptr__->_M_node = ppaStack_30;
    return __return_storage_ptr__;
  }
  std::__throw_bad_function_call();
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}